

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

uint32_t F3DAudioInitialize8(uint32_t SpeakerChannelMask,float SpeedOfSound,uint8_t *Instance)

{
  uint32_t uVar1;
  uint *in_RSI;
  uint in_EDI;
  uint in_XMM0_Da;
  uint32_t speakerCount;
  anon_union_4_2_947300a4 epsilonHack;
  undefined4 in_stack_00000018;
  uint32_t in_stack_00000024;
  uint local_20;
  uint local_8;
  uint32_t local_4;
  
  local_20 = 0;
  uVar1 = F3DAudioCheckInitParams
                    (in_stack_00000024,(float)SpeakerChannelMask,
                     (uint8_t *)CONCAT44(SpeedOfSound,in_stack_00000018));
  if (uVar1 == 0) {
    local_4 = 0x88960001;
  }
  else {
    *in_RSI = in_EDI;
    in_RSI[3] = in_XMM0_Da;
    in_RSI[4] = in_XMM0_Da - 1;
    in_RSI[2] = 0xffffffff;
    local_8 = in_EDI;
    if ((in_EDI & 8) != 0) {
      if ((in_EDI & 4) == 0) {
        in_RSI[2] = 2;
      }
      else {
        in_RSI[2] = 3;
      }
    }
    for (; local_8 != 0; local_8 = local_8 - 1 & local_8) {
      local_20 = local_20 + 1;
    }
    in_RSI[1] = local_20;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t F3DAudioInitialize8(
	uint32_t SpeakerChannelMask,
	float SpeedOfSound,
	F3DAUDIO_HANDLE Instance
) {
	union
	{
		float f;
		uint32_t i;
	} epsilonHack;
	uint32_t speakerCount = 0;

	if (!F3DAudioCheckInitParams(SpeakerChannelMask, SpeedOfSound, Instance))
	{
		return FAUDIO_E_INVALID_CALL;
	}

	SPEAKERMASK(Instance) = SpeakerChannelMask;
	SPEEDOFSOUND(Instance) = SpeedOfSound;

	/* "Convert" raw float to int... */
	epsilonHack.f = SpeedOfSound;
	/* ... Subtract epsilon value... */
	epsilonHack.i -= 1;
	/* ... Convert back to float. */
	SPEEDOFSOUNDEPSILON(Instance) = epsilonHack.f;

	SPEAKER_LF_INDEX(Instance) = 0xFFFFFFFF;
	if (SpeakerChannelMask & SPEAKER_LOW_FREQUENCY)
	{
		if (SpeakerChannelMask & SPEAKER_FRONT_CENTER)
		{
			SPEAKER_LF_INDEX(Instance) = 3;
		}
		else
		{
			SPEAKER_LF_INDEX(Instance) = 2;
		}
	}

	while (SpeakerChannelMask)
	{
		speakerCount += 1;
		SpeakerChannelMask &= SpeakerChannelMask - 1;
	}
	SPEAKERCOUNT(Instance) = speakerCount;

	return 0;
}